

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

void CChat::ConChat(IResult *pResult,void *pUserData)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar4;
  long *plVar5;
  uint uVar6;
  
  iVar2 = (*pResult->_vptr_IResult[4])(pResult,0);
  pcVar4 = (char *)CONCAT44(extraout_var,iVar2);
  iVar2 = str_comp(pcVar4,"all");
  if (iVar2 == 0) {
    iVar2 = 1;
  }
  else {
    iVar2 = str_comp(pcVar4,"team");
    if (iVar2 != 0) {
      iVar2 = str_comp(pcVar4,"whisper");
      if (iVar2 == 0) {
        if (pResult->m_NumArgs == 2) {
          uVar3 = (*pResult->_vptr_IResult[2])(pResult,1);
        }
        else {
          uVar1 = *(uint *)((long)pUserData + 0x25c48);
          iVar2 = 0;
          do {
            uVar3 = uVar1 + iVar2;
            uVar6 = uVar1 + 0x3f + iVar2;
            if (-1 < (int)uVar3) {
              uVar6 = uVar3;
            }
            uVar3 = uVar3 - (uVar6 & 0xffffffc0);
          } while (((*(char *)(*(long *)((long)pUserData + 8) + 0x4aec + (long)(int)uVar3 * 0x5b0)
                     != '\x01') || (*(uint *)(*(long *)((long)pUserData + 8) + 0x1b140) == uVar3))
                  && (iVar2 = iVar2 + 1, uVar3 = uVar1, iVar2 != 0x40));
        }
        if (((uVar3 < 0x40) &&
            (*(char *)(*(long *)((long)pUserData + 8) + 0x4aec + (ulong)uVar3 * 0x5b0) == '\x01'))
           && (*(uint *)(*(long *)((long)pUserData + 8) + 0x1b140) != uVar3)) {
          *(uint *)((long)pUserData + 0x25c48) = uVar3;
          iVar2 = 3;
          goto LAB_00136667;
        }
        if (pResult->m_NumArgs != 2) {
          return;
        }
        plVar5 = *(long **)(*(long *)((long)pUserData + 8) + 0x870);
        UNRECOVERED_JUMPTABLE = *(code **)(*plVar5 + 200);
        pcVar4 = "please enter a valid ClientID";
      }
      else {
        plVar5 = *(long **)(*(long *)((long)pUserData + 8) + 0x870);
        UNRECOVERED_JUMPTABLE = *(code **)(*plVar5 + 200);
        pcVar4 = "expected all, team or whisper as mode";
      }
      (*UNRECOVERED_JUMPTABLE)(plVar5,0,"console",pcVar4,0);
      return;
    }
    iVar2 = 2;
  }
LAB_00136667:
  EnableMode((CChat *)pUserData,iVar2,(char *)0x0);
  return;
}

Assistant:

void CChat::ConChat(IConsole::IResult *pResult, void *pUserData)
{
	CChat *pChat = (CChat *)pUserData;

	const char *pMode = pResult->GetString(0);
	if(str_comp(pMode, "all") == 0)
		pChat->EnableMode(CHAT_ALL);
	else if(str_comp(pMode, "team") == 0)
		pChat->EnableMode(CHAT_TEAM);
	else if(str_comp(pMode, "whisper") == 0)
	{
		int Target = pChat->m_WhisperTarget; // default to ID of last target
		if(pResult->NumArguments() == 2)
			Target = pResult->GetInteger(1);
		else
		{
			// pick next valid player as target
			for(int i = 0; i < MAX_CLIENTS; i++)
			{
				int ClientID = (Target + i) % MAX_CLIENTS;
				if(pChat->m_pClient->m_aClients[ClientID].m_Active && pChat->m_pClient->m_LocalClientID != ClientID)
				{
					Target = ClientID;
					break;
				}
			}
		}
		if(Target < 0 || Target >= MAX_CLIENTS || !pChat->m_pClient->m_aClients[Target].m_Active || pChat->m_pClient->m_LocalClientID == Target)
		{
			if(pResult->NumArguments() == 2)
				pChat->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", "please enter a valid ClientID");
		}
		else
		{
			pChat->m_WhisperTarget = Target;
			pChat->EnableMode(CHAT_WHISPER);
		}
	}
	else
		((CChat*)pUserData)->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", "expected all, team or whisper as mode");
}